

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::ResizeInternalTestLarge_TestInternalResizeWorks_Test::
~ResizeInternalTestLarge_TestInternalResizeWorks_Test
          (ResizeInternalTestLarge_TestInternalResizeWorks_Test *this)

{
  ResizeInternalTestLarge_TestInternalResizeWorks_Test *in_stack_00000010;
  
  anon_unknown.dwarf_ccb0f7::ResizeInternalTestLarge_TestInternalResizeWorks_Test::
  ~ResizeInternalTestLarge_TestInternalResizeWorks_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(ResizeInternalTestLarge, TestInternalResizeWorks) {
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 10);
  init_flags_ = AOM_CODEC_USE_PSNR;
  change_config_ = false;

  // q picked such that initial keyframe on this clip is ~30dB PSNR
  cfg_.rc_min_quantizer = cfg_.rc_max_quantizer = 48;

  // If the number of frames being encoded is smaller than g_lag_in_frames
  // the encoded frame is unavailable using the current API. Comparing
  // frames to detect mismatch would then not be possible. Set
  // g_lag_in_frames = 0 to get around this.
  cfg_.g_lag_in_frames = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

  for (const auto &info : frame_info_list_) {
    const aom_codec_pts_t pts = info.pts;
    if (pts >= kStepDownFrame && pts < kStepUpFrame) {
      ASSERT_EQ(282U, info.w) << "Frame " << pts << " had unexpected width";
      ASSERT_EQ(173U, info.h) << "Frame " << pts << " had unexpected height";
    } else {
      EXPECT_EQ(352U, info.w) << "Frame " << pts << " had unexpected width";
      EXPECT_EQ(288U, info.h) << "Frame " << pts << " had unexpected height";
    }
  }
}